

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O0

UChar32 __thiscall icu_63::numparse::impl::StringSegment::getCodePoint(StringSegment *this)

{
  char16_t cVar1;
  char16_t lead;
  StringSegment *this_local;
  
  cVar1 = UnicodeString::charAt(&this->fStr,this->fStart);
  if (((cVar1 & 0xfc00U) == 0xd800) && (this->fStart + 1 < this->fEnd)) {
    this_local._4_4_ = UnicodeString::char32At(&this->fStr,this->fStart);
  }
  else if ((cVar1 & 0xf800U) == 0xd800) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this_local._4_4_ = (uint)(ushort)cVar1;
  }
  return this_local._4_4_;
}

Assistant:

UChar32 StringSegment::getCodePoint() const {
    char16_t lead = fStr.charAt(fStart);
    if (U16_IS_LEAD(lead) && fStart + 1 < fEnd) {
        return fStr.char32At(fStart);
    } else if (U16_IS_SURROGATE(lead)) {
        return -1;
    } else {
        return lead;
    }
}